

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

Metadata google::protobuf::Message::GetMetadataImpl(ClassDataFull *data)

{
  Metadata MVar1;
  anon_class_8_1_a8aa2aee local_30;
  DescriptorTable *local_28;
  DescriptorTable *table;
  ClassDataFull *data_local;
  
  local_28 = data->descriptor_table;
  table = (DescriptorTable *)data;
  if (local_28 != (DescriptorTable *)0x0) {
    if (data->get_metadata_tracker != (_func_void *)0x0) {
      (*data->get_metadata_tracker)();
    }
    local_30.table = local_28;
    absl::lts_20250127::
    call_once<google::protobuf::Message::GetMetadataImpl(google::protobuf::internal::ClassDataFull_const&)::__0>
              (local_28->once,&local_30);
  }
  MVar1.reflection = (Reflection *)table->file_level_service_descriptors;
  MVar1.descriptor = *(Descriptor **)(table + 1);
  return MVar1;
}

Assistant:

Metadata Message::GetMetadataImpl(const internal::ClassDataFull& data) {
  auto* table = data.descriptor_table;
  // Only codegen types provide a table. DynamicMessage does not provide a table
  // and instead eagerly initializes the descriptor/reflection members.
  if (ABSL_PREDICT_TRUE(table != nullptr)) {
    if (ABSL_PREDICT_FALSE(data.get_metadata_tracker != nullptr)) {
      data.get_metadata_tracker();
    }
    absl::call_once(*table->once, [table] {
      internal::AssignDescriptorsOnceInnerCall(table);
    });
  }
  return {data.descriptor, data.reflection};
}